

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O0

void __thiscall Client::WriteHandler(Client *this,error_code ec,size_t length)

{
  bool bVar1;
  ostream *poVar2;
  error_code local_48 [2];
  size_t local_28;
  size_t length_local;
  Client *this_local;
  error_code ec_local;
  
  ec_local._0_8_ = ec.cat_;
  this_local = ec._0_8_;
  local_28 = length;
  length_local = (size_t)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Write failed: ");
    boost::system::error_code::message_abi_cxx11_(local_48);
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    AsyncReadSome(this);
  }
  return;
}

Assistant:

void Client::WriteHandler(boost::system::error_code ec, std::size_t length) {
  if (ec) {
    std::cerr << "Write failed: " << ec.message() << std::endl;
  } else {
    AsyncReadSome();
  }
}